

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O2

int loadArgs(int argc,char **argv,Settings *s,Transformation *t,string *fjson)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  double dVar4;
  allocator<char> local_91;
  char **local_90;
  string *local_88;
  Settings *local_80;
  string *local_78;
  string local_70;
  string str;
  
  iVar3 = 0;
  t->enable = false;
  s->stat = false;
  local_90 = argv;
  local_80 = s;
  local_78 = fjson;
  if (argc < 2) {
    usage();
    iVar3 = -1;
  }
  else {
    local_88 = (string *)&t->outdir;
    while (iVar3 < argc + -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&str,local_90[(long)iVar3 + 1],(allocator<char> *)&local_70);
      bVar1 = std::operator==(&str,"-t");
      if (bVar1) {
        t->enable = true;
        std::__cxx11::string::assign((char *)local_88);
        poVar2 = std::operator<<((ostream *)&std::cout,"Transformation directory = \"");
        poVar2 = std::operator<<(poVar2,local_88);
        std::operator<<(poVar2,"\".\n");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,local_90[(long)iVar3 + 3],&local_91);
        dVar4 = std::__cxx11::stod(&local_70,(size_t *)0x0);
        t->x = dVar4;
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,local_90[(long)iVar3 + 4],&local_91);
        dVar4 = std::__cxx11::stod(&local_70,(size_t *)0x0);
        t->y = dVar4;
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,local_90[(long)iVar3 + 5],&local_91);
        dVar4 = std::__cxx11::stod(&local_70,(size_t *)0x0);
        t->rot = dVar4;
        std::__cxx11::string::~string((string *)&local_70);
        std::operator<<((ostream *)&std::cout,"X translation = ");
        poVar2 = std::ostream::_M_insert<double>(t->x);
        std::operator<<(poVar2,"\n");
        std::operator<<((ostream *)&std::cout,"Y translation = ");
        poVar2 = std::ostream::_M_insert<double>(t->y);
        std::operator<<(poVar2,"\n");
        std::operator<<((ostream *)&std::cout,"Rotation      = ");
        poVar2 = std::ostream::_M_insert<double>(t->rot);
        std::operator<<(poVar2,"\n");
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        iVar3 = iVar3 + 5;
      }
      else {
        iVar3 = iVar3 + 1;
        bVar1 = std::operator==(&str,"-s");
        if (bVar1) {
          local_80->stat = true;
        }
        else {
          std::__cxx11::string::_M_assign((string *)local_78);
        }
      }
      std::__cxx11::string::~string((string *)&str);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int loadArgs(int argc, char* argv[], Settings& s, Transformation& t, std::string& fjson)
{
	t.enable = false;
	s.stat = false;

	if (argc < 2)
	{
		return usage();
	}

	int i = 0;
	while (i < argc - 1)
	{
		try
		{
			std::string str = argv[++i];
			if (str == "-t")
			{
				// Transformation args
				t.enable = true;
				t.outdir = argv[++i];
				std::cout << "Transformation directory = \"" << t.outdir << "\".\n";
				t.x   = std::stod(argv[++i]);
				t.y   = std::stod(argv[++i]);
				t.rot = std::stod(argv[++i]);
				std::cout << "X translation = " << t.x   << "\n";
				std::cout << "Y translation = " << t.y   << "\n";
				std::cout << "Rotation      = " << t.rot << "\n";
				std::cout << std::endl;
			}
			else if (str == "-s")
			{
				// Summary statistics
				s.stat = true;
			}
			else
				fjson = str;
		}
		catch (const std::exception& e)
		{
			std::cout << e.what() << std::endl;
			return usage();
		}
	}
	return 0;
}